

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

string * __thiscall CppGenerator::genTupleStructConstructors_abi_cxx11_(CppGenerator *this)

{
  element_type *this_00;
  CppGenerator *this_01;
  TreeDecomposition *pTVar1;
  View *__lhs;
  ulong uVar2;
  string *in_RDI;
  Attribute *att_1;
  size_t var_1;
  View *view;
  size_t viewID;
  Attribute *att;
  size_t var;
  var_bitset *bag;
  string *relName;
  TDNode *rel;
  size_t relID;
  string attrAssign;
  string attrConstruct;
  string tupleStruct;
  Attribute *in_stack_fffffffffffff7c8;
  undefined7 in_stack_fffffffffffff7d0;
  byte in_stack_fffffffffffff7d7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7d8;
  TreeDecomposition *in_stack_fffffffffffff7e0;
  TreeDecomposition *this_02;
  string *in_stack_fffffffffffff7f0;
  Attribute *in_stack_fffffffffffff7f8;
  undefined7 in_stack_fffffffffffff800;
  undefined1 in_stack_fffffffffffff807;
  CppGenerator *in_stack_fffffffffffff808;
  CppGenerator *pCVar3;
  string local_7b0 [32];
  string local_790 [32];
  string local_770 [32];
  string local_750 [32];
  string local_730 [32];
  string local_710 [32];
  string local_6f0 [32];
  string local_6d0 [32];
  string local_6b0 [32];
  string local_690 [32];
  string local_670 [32];
  string local_650 [32];
  string local_630 [32];
  string local_610 [32];
  string local_5f0 [32];
  string local_5d0 [32];
  string local_5b0 [32];
  string local_590 [32];
  string local_570 [32];
  string local_550 [32];
  string local_530 [32];
  string local_510 [32];
  Attribute *local_4f0;
  reference local_4e8;
  ulong local_4d8;
  View *local_4d0;
  TreeDecomposition *local_4c8;
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  Attribute *local_1e0;
  ulong local_1d8;
  string local_1d0 [32];
  string local_1b0 [32];
  size_type *local_190;
  CppGenerator *local_188;
  CppGenerator *local_180;
  CppGenerator *local_178;
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [48];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  offset_abi_cxx11_(in_stack_fffffffffffff808,
                    CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
  std::operator+(in_stack_fffffffffffff7d8,
                 (char *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
  std::operator+(in_stack_fffffffffffff7d8,
                 (char *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
  std::operator+(in_stack_fffffffffffff7d8,
                 (char *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
  std::operator+(in_stack_fffffffffffff7d8,
                 (char *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
  std::operator+(in_stack_fffffffffffff7d8,
                 (char *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
  std::operator+(in_stack_fffffffffffff7d8,
                 (char *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
  std::operator+(in_stack_fffffffffffff7d8,
                 (char *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"",&local_141);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"",&local_169);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  local_178 = (CppGenerator *)0x0;
  while( true ) {
    pCVar3 = local_178;
    this_00 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x28a022);
    this_01 = (CppGenerator *)TreeDecomposition::numberOfRelations(this_00);
    if (this_01 <= pCVar3) break;
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x28a052);
    in_stack_fffffffffffff808 =
         (CppGenerator *)
         TreeDecomposition::getRelation
                   ((TreeDecomposition *)
                    CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                    (size_t)in_stack_fffffffffffff7c8);
    local_190 = &(in_stack_fffffffffffff808->_datasetName)._M_string_length;
    local_188 = in_stack_fffffffffffff808;
    local_180 = in_stack_fffffffffffff808;
    offset_abi_cxx11_(in_stack_fffffffffffff808,
                      CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
    std::operator+(in_stack_fffffffffffff7d8,
                   (char *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
    std::__cxx11::string::operator=(local_140,local_1b0);
    std::__cxx11::string::~string(local_1b0);
    std::__cxx11::string::~string(local_1d0);
    for (local_1d8 = 0; local_1d8 < 100; local_1d8 = local_1d8 + 1) {
      in_stack_fffffffffffff807 =
           std::bitset<100UL>::operator[]
                     ((bitset<100UL> *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0)
                      ,(size_t)in_stack_fffffffffffff7c8);
      if ((bool)in_stack_fffffffffffff807) {
        std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x28a151);
        in_stack_fffffffffffff7f8 =
             TreeDecomposition::getAttribute
                       (in_stack_fffffffffffff7e0,(size_t)in_stack_fffffffffffff7d8);
        local_1e0 = in_stack_fffffffffffff7f8;
        if (((in_stack_fffffffffffff7f8->_constant).first & 1U) == 0) {
          offset_abi_cxx11_(in_stack_fffffffffffff808,
                            CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
          std::operator+((char *)in_stack_fffffffffffff7d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
          std::operator+(in_stack_fffffffffffff7d8,
                         (char *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
          typeToStr_abi_cxx11_(this_01,(Type)((ulong)pCVar3 >> 0x20));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff808,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
          std::operator+(in_stack_fffffffffffff7d8,
                         (char *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
          std::operator+(in_stack_fffffffffffff7d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
          std::operator+(in_stack_fffffffffffff7d8,
                         (char *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
          std::__cxx11::string::operator+=(local_140,local_200);
          std::__cxx11::string::~string(local_200);
          std::__cxx11::string::~string(local_220);
          std::__cxx11::string::~string(local_240);
          std::__cxx11::string::~string(local_260);
          std::__cxx11::string::~string(local_2e0);
          std::__cxx11::string::~string(local_280);
          std::__cxx11::string::~string(local_2a0);
          std::__cxx11::string::~string(local_2c0);
        }
      }
    }
    in_stack_fffffffffffff7f0 = local_140;
    std::__cxx11::string::pop_back();
    std::__cxx11::string::pop_back();
    offset_abi_cxx11_(in_stack_fffffffffffff808,
                      CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
    std::operator+((char *)in_stack_fffffffffffff7d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
    std::operator+(in_stack_fffffffffffff7d8,
                   (char *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
    offset_abi_cxx11_(in_stack_fffffffffffff808,
                      CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff808,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
    std::__cxx11::string::operator+=(local_140,local_300);
    std::__cxx11::string::~string(local_300);
    std::__cxx11::string::~string(local_380);
    std::__cxx11::string::~string(local_320);
    std::__cxx11::string::~string(local_340);
    std::__cxx11::string::~string(local_360);
    offset_abi_cxx11_(in_stack_fffffffffffff808,
                      CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
    std::operator+(in_stack_fffffffffffff7d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
    std::operator+(in_stack_fffffffffffff7d8,
                   (char *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
    std::operator+(in_stack_fffffffffffff7d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
    std::operator+(in_stack_fffffffffffff7d8,
                   (char *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
    offset_abi_cxx11_(in_stack_fffffffffffff808,
                      CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff808,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
    std::operator+(in_stack_fffffffffffff7d8,
                   (char *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
    std::operator+(in_stack_fffffffffffff7d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
    std::operator+(in_stack_fffffffffffff7d8,
                   (char *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
    std::__cxx11::string::operator+=(local_30,local_3a0);
    std::__cxx11::string::~string(local_3a0);
    std::__cxx11::string::~string(local_3c0);
    std::__cxx11::string::~string(local_3e0);
    std::__cxx11::string::~string(local_400);
    std::__cxx11::string::~string(local_4c0);
    std::__cxx11::string::~string(local_420);
    std::__cxx11::string::~string(local_440);
    std::__cxx11::string::~string(local_460);
    std::__cxx11::string::~string(local_480);
    std::__cxx11::string::~string(local_4a0);
    local_178 = (CppGenerator *)((long)&(local_178->super_CodeGenerator)._vptr_CodeGenerator + 1);
  }
  local_4c8 = (TreeDecomposition *)0x0;
  while( true ) {
    this_02 = local_4c8;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x28aaf5);
    pTVar1 = (TreeDecomposition *)QueryCompiler::numberOfViews((QueryCompiler *)0x28aafd);
    if (pTVar1 <= this_02) break;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x28ab25);
    __lhs = QueryCompiler::getView
                      ((QueryCompiler *)
                       CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                       (size_t)in_stack_fffffffffffff7c8);
    local_4d0 = __lhs;
    std::__cxx11::string::operator=(local_140,"");
    std::__cxx11::string::operator=(local_168,"");
    for (local_4d8 = 0; local_4d8 < 100; local_4d8 = local_4d8 + 1) {
      std::bitset<100UL>::operator[]
                ((bitset<100UL> *)__lhs,
                 CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
      in_stack_fffffffffffff7d7 =
           std::bitset::reference::operator_cast_to_bool
                     ((reference *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
      std::bitset<100UL>::reference::~reference(&local_4e8);
      if ((in_stack_fffffffffffff7d7 & 1) != 0) {
        std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x28abec);
        in_stack_fffffffffffff7c8 = TreeDecomposition::getAttribute(this_02,(size_t)__lhs);
        local_4f0 = in_stack_fffffffffffff7c8;
        typeToStr_abi_cxx11_(this_01,(Type)((ulong)pCVar3 >> 0x20));
        std::operator+((char *)__lhs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                       (char *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                       (char *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
        std::__cxx11::string::operator+=(local_140,local_510);
        std::__cxx11::string::~string(local_510);
        std::__cxx11::string::~string(local_530);
        std::__cxx11::string::~string(local_550);
        std::__cxx11::string::~string(local_570);
        std::__cxx11::string::~string(local_590);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff7f8,(char *)in_stack_fffffffffffff7f0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                       (char *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
        std::__cxx11::string::operator+=(local_168,local_5b0);
        std::__cxx11::string::~string(local_5b0);
        std::__cxx11::string::~string(local_5d0);
        std::__cxx11::string::~string(local_5f0);
      }
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::pop_back();
      std::__cxx11::string::pop_back();
      offset_abi_cxx11_(in_stack_fffffffffffff808,
                        CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (char *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (char *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (char *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (char *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
      std::__cxx11::string::operator+=(local_30,local_610);
      std::__cxx11::string::~string(local_610);
      std::__cxx11::string::~string(local_630);
      std::__cxx11::string::~string(local_650);
      std::__cxx11::string::~string(local_670);
      std::__cxx11::string::~string(local_690);
      std::__cxx11::string::~string(local_6b0);
      std::__cxx11::string::~string(local_6d0);
      std::__cxx11::string::~string(local_6f0);
      std::__cxx11::string::~string(local_710);
    }
    else {
      offset_abi_cxx11_(in_stack_fffffffffffff808,
                        CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (char *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (char *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
      std::__cxx11::string::operator+=(local_30,local_730);
      std::__cxx11::string::~string(local_730);
      std::__cxx11::string::~string(local_750);
      std::__cxx11::string::~string(local_770);
      std::__cxx11::string::~string(local_790);
      std::__cxx11::string::~string(local_7b0);
    }
    local_4c8 = (TreeDecomposition *)((long)&local_4c8->_root + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff7f8,(char *)in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string CppGenerator::genTupleStructConstructors()
{
    std::string tupleStruct = offset(0)+"#include \"DataHandler.h\"\n"+
        "#include <boost/spirit/include/qi.hpp>\n"+
        "#include <boost/spirit/include/phoenix_core.hpp>\n"+
        "#include <boost/spirit/include/phoenix_operator.hpp>\n\n"+
        "namespace qi = boost::spirit::qi;\n"+
        "namespace phoenix = boost::phoenix;\n\n"+
        "namespace lmfao\n{\n";
    
    std::string attrConstruct = "", attrAssign = "";
    
    for (size_t relID = 0; relID < _td->numberOfRelations(); ++relID)
    {
        TDNode* rel = _td->getRelation(relID);
        const std::string& relName = rel->_name;
        const var_bitset& bag = rel->_bag;

        attrConstruct = offset(2)+"qi::phrase_parse(tuple.begin(),tuple.end(),";
        // size_t field = 0;
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (bag[var])
            {
                Attribute* att = _td->getAttribute(var);

                if (!att->_constant.first) 
                    attrConstruct += "\n"+offset(3)+"qi::"+typeToStr(att->_type)+
                        "_[phoenix::ref("+att->_name+") = qi::_1]>>";
            }
        }
        // attrConstruct.pop_back();
        attrConstruct.pop_back();
        attrConstruct.pop_back();
        attrConstruct += ",\n"+offset(3)+"\'|\');\n"+offset(1);

        tupleStruct += offset(1)+relName+"_tuple::"+relName+
            "_tuple(const std::string& tuple)\n"+offset(1)+"{\n"+attrConstruct+"}\n\n";
    }

    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        View* view = _qc->getView(viewID);

        attrConstruct = "";
        attrAssign = "";

        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (view->_fVars[var])
            {
                Attribute* att = _td->getAttribute(var);
                attrConstruct += "const "+typeToStr(att->_type)+"& "+att->_name+",";
                attrAssign += att->_name+"("+att->_name+"),";
            }
        }        
        if (!attrConstruct.empty())
        {
            attrAssign.pop_back();
            attrConstruct.pop_back();
            
            tupleStruct +=  offset(1)+viewName[viewID]+"_tuple::"+
                viewName[viewID]+"_tuple("+attrConstruct+") : "+
                attrAssign+"{}\n\n";
        }
        else
            tupleStruct += offset(1)+viewName[viewID]+"_tuple::"+
                viewName[viewID]+"_tuple(){}\n\n";
    }
    return tupleStruct+"}\n";
}